

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::FormulasLoader::begin__formula
          (FormulasLoader *this,formula__AttributeData *attributeData)

{
  _func_int **pp_Var1;
  long *in_RSI;
  HelperLoaderBase *in_RDI;
  ClassId in_stack_0000003c;
  ParserChar *in_stack_00000040;
  IFilePartLoader *in_stack_00000048;
  String *in_stack_fffffffffffffe98;
  Formula *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  IFilePartLoader *in_stack_fffffffffffffeb0;
  UniqueId *in_stack_fffffffffffffeb8;
  Formula *in_stack_fffffffffffffec0;
  allocator<char> *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  undefined1 local_d1 [40];
  allocator<char> local_a9;
  string local_a8 [39];
  undefined1 local_81 [40];
  allocator<char> local_59;
  string local_58 [35];
  undefined1 local_35;
  UniqueId local_28;
  long *local_10;
  
  local_10 = in_RSI;
  pp_Var1 = (_func_int **)operator_new(0xa8);
  local_35 = 1;
  HelperLoaderBase::getHandlingFilePartLoader(in_RDI);
  COLLADAFW::ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1002>::ID();
  IFilePartLoader::createUniqueIdFromId(in_stack_00000048,in_stack_00000040,in_stack_0000003c);
  COLLADAFW::Formula::Formula(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_35 = 0;
  in_RDI[1]._vptr_HelperLoaderBase = pp_Var1;
  COLLADAFW::UniqueId::~UniqueId(&local_28);
  if (local_10[1] == 0) {
    if (*local_10 == 0) {
      if (local_10[2] != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
        COLLADAFW::Formula::setName(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator(&local_a9);
      }
    }
    else {
      in_stack_fffffffffffffed0 = (allocator<char> *)in_RDI[1]._vptr_HelperLoaderBase;
      in_stack_fffffffffffffed8 = (char *)*local_10;
      in_stack_fffffffffffffee0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_81;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      COLLADAFW::Formula::setName(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      std::__cxx11::string::~string((string *)(local_81 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_81);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    COLLADAFW::Formula::setName(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  if (*local_10 != 0) {
    in_stack_fffffffffffffea0 = (Formula *)in_RDI[1]._vptr_HelperLoaderBase;
    in_stack_fffffffffffffea8 = (char *)*local_10;
    in_stack_fffffffffffffeb0 = (IFilePartLoader *)local_d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    COLLADAFW::Formula::setOriginalId(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::__cxx11::string::~string((string *)(local_d1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_d1);
  }
  HelperLoaderBase::getHandlingFilePartLoader(in_RDI);
  IFilePartLoader::addToSidTree
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,
             (Object *)in_stack_fffffffffffffe98);
  return true;
}

Assistant:

bool FormulasLoader::begin__formula( const formula__AttributeData& attributeData )
	{
		mCurrentFormula = FW_NEW COLLADAFW::Formula( getHandlingFilePartLoader()->createUniqueIdFromId( attributeData.id, COLLADAFW::Formula::ID()) );
		if ( attributeData.name )
			mCurrentFormula->setName( attributeData.name );
		else if ( attributeData.id )
			mCurrentFormula->setName( attributeData.id );
		else if ( attributeData.sid )
			mCurrentFormula->setName( attributeData.sid );

		if ( attributeData.id )
			mCurrentFormula->setOriginalId ( attributeData.id );

		getHandlingFilePartLoader()->addToSidTree( attributeData.id, attributeData.sid, mCurrentFormula );

		return true;
	}